

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O2

void PredictorSub5_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  undefined1 auVar18 [16];
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  char cVar22;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  auVar18 = _DAT_001a8610;
  lVar19 = 0;
  lVar20 = 0;
  while (lVar20 + 4 <= (long)num_pixels) {
    auVar24 = *(undefined1 (*) [16])((long)upper + lVar19);
    auVar21 = *(undefined1 (*) [16])((long)upper + lVar19 + 4);
    auVar23 = *(undefined1 (*) [16])((long)in + lVar19 + -4);
    pcVar1 = (char *)((long)in + lVar19);
    cVar3 = pcVar1[1];
    cVar4 = pcVar1[2];
    cVar5 = pcVar1[3];
    cVar6 = pcVar1[4];
    cVar7 = pcVar1[5];
    cVar8 = pcVar1[6];
    cVar9 = pcVar1[7];
    cVar10 = pcVar1[8];
    cVar11 = pcVar1[9];
    cVar12 = pcVar1[10];
    cVar13 = pcVar1[0xb];
    cVar14 = pcVar1[0xc];
    cVar15 = pcVar1[0xd];
    cVar16 = pcVar1[0xe];
    cVar17 = pcVar1[0xf];
    cVar22 = pavgb(auVar23[0],auVar21[0]);
    cVar25 = pavgb(auVar23[1],auVar21[1]);
    cVar26 = pavgb(auVar23[2],auVar21[2]);
    cVar27 = pavgb(auVar23[3],auVar21[3]);
    cVar28 = pavgb(auVar23[4],auVar21[4]);
    cVar29 = pavgb(auVar23[5],auVar21[5]);
    cVar30 = pavgb(auVar23[6],auVar21[6]);
    cVar31 = pavgb(auVar23[7],auVar21[7]);
    cVar32 = pavgb(auVar23[8],auVar21[8]);
    cVar33 = pavgb(auVar23[9],auVar21[9]);
    cVar34 = pavgb(auVar23[10],auVar21[10]);
    cVar35 = pavgb(auVar23[0xb],auVar21[0xb]);
    cVar36 = pavgb(auVar23[0xc],auVar21[0xc]);
    cVar37 = pavgb(auVar23[0xd],auVar21[0xd]);
    cVar38 = pavgb(auVar23[0xe],auVar21[0xe]);
    cVar39 = pavgb(auVar23[0xf],auVar21[0xf]);
    auVar21 = (auVar21 ^ auVar23) & auVar18;
    auVar23[0] = cVar22 - auVar21[0];
    auVar23[1] = cVar25 - auVar21[1];
    auVar23[2] = cVar26 - auVar21[2];
    auVar23[3] = cVar27 - auVar21[3];
    auVar23[4] = cVar28 - auVar21[4];
    auVar23[5] = cVar29 - auVar21[5];
    auVar23[6] = cVar30 - auVar21[6];
    auVar23[7] = cVar31 - auVar21[7];
    auVar23[8] = cVar32 - auVar21[8];
    auVar23[9] = cVar33 - auVar21[9];
    auVar23[10] = cVar34 - auVar21[10];
    auVar23[0xb] = cVar35 - auVar21[0xb];
    auVar23[0xc] = cVar36 - auVar21[0xc];
    auVar23[0xd] = cVar37 - auVar21[0xd];
    auVar23[0xe] = cVar38 - auVar21[0xe];
    auVar23[0xf] = cVar39 - auVar21[0xf];
    cVar22 = pavgb(auVar23[0],auVar24[0]);
    cVar25 = pavgb(auVar23[1],auVar24[1]);
    cVar26 = pavgb(auVar23[2],auVar24[2]);
    cVar27 = pavgb(auVar23[3],auVar24[3]);
    cVar28 = pavgb(auVar23[4],auVar24[4]);
    cVar29 = pavgb(auVar23[5],auVar24[5]);
    cVar30 = pavgb(auVar23[6],auVar24[6]);
    cVar31 = pavgb(auVar23[7],auVar24[7]);
    cVar32 = pavgb(auVar23[8],auVar24[8]);
    cVar33 = pavgb(auVar23[9],auVar24[9]);
    cVar34 = pavgb(auVar23[10],auVar24[10]);
    cVar35 = pavgb(auVar23[0xb],auVar24[0xb]);
    cVar36 = pavgb(auVar23[0xc],auVar24[0xc]);
    cVar37 = pavgb(auVar23[0xd],auVar24[0xd]);
    cVar38 = pavgb(auVar23[0xe],auVar24[0xe]);
    cVar39 = pavgb(auVar23[0xf],auVar24[0xf]);
    auVar24 = (auVar23 ^ auVar24) & auVar18;
    pcVar2 = (char *)((long)out + lVar19);
    *pcVar2 = auVar24[0] + (*pcVar1 - cVar22);
    pcVar2[1] = auVar24[1] + (cVar3 - cVar25);
    pcVar2[2] = auVar24[2] + (cVar4 - cVar26);
    pcVar2[3] = auVar24[3] + (cVar5 - cVar27);
    pcVar2[4] = auVar24[4] + (cVar6 - cVar28);
    pcVar2[5] = auVar24[5] + (cVar7 - cVar29);
    pcVar2[6] = auVar24[6] + (cVar8 - cVar30);
    pcVar2[7] = auVar24[7] + (cVar9 - cVar31);
    pcVar2[8] = auVar24[8] + (cVar10 - cVar32);
    pcVar2[9] = auVar24[9] + (cVar11 - cVar33);
    pcVar2[10] = auVar24[10] + (cVar12 - cVar34);
    pcVar2[0xb] = auVar24[0xb] + (cVar13 - cVar35);
    pcVar2[0xc] = auVar24[0xc] + (cVar14 - cVar36);
    pcVar2[0xd] = auVar24[0xd] + (cVar15 - cVar37);
    pcVar2[0xe] = auVar24[0xe] + (cVar16 - cVar38);
    pcVar2[0xf] = auVar24[0xf] + (cVar17 - cVar39);
    lVar19 = lVar19 + 0x10;
    lVar20 = lVar20 + 4;
  }
  if (num_pixels == (int)lVar20) {
    return;
  }
  (*VP8LPredictorsSub_C[5])
            ((uint32_t *)((long)in + lVar19),(uint32_t *)((long)upper + lVar19),
             num_pixels - (int)lVar20,(uint32_t *)((long)out + lVar19));
  return;
}

Assistant:

static void PredictorSub5_SSE2(const uint32_t* in, const uint32_t* upper,
                               int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TR = _mm_loadu_si128((const __m128i*)&upper[i + 1]);
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    __m128i avg, pred, res;
    Average2_m128i(&L, &TR, &avg);
    Average2_m128i(&avg, &T, &pred);
    res = _mm_sub_epi8(src, pred);
    _mm_storeu_si128((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[5](in + i, upper + i, num_pixels - i, out + i);
  }
}